

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_warc.c
# Opt level: O1

int archive_write_set_format_warc(archive *_a)

{
  int iVar1;
  byte *pbVar2;
  time_t tVar3;
  int iVar4;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_warc");
  iVar4 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((code *)_a[2].archive_format_name != (code *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    pbVar2 = (byte *)malloc(0x20);
    if (pbVar2 == (byte *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate warc data");
    }
    else {
      *pbVar2 = *pbVar2 & 0xfe;
      iVar4 = 0;
      tVar3 = time((time_t *)0x0);
      *(time_t *)(pbVar2 + 8) = tVar3;
      pbVar2[0x10] = 0;
      pbVar2[0x11] = 0;
      pbVar2[0x12] = 0;
      pbVar2[0x13] = 0;
      *(int *)(pbVar2 + 0x14) = (int)tVar3;
      _a[1].read_data_offset = (int64_t)pbVar2;
      _a[1].read_data_output_offset = (int64_t)"WARC/1.0";
      *(code **)&_a[1].read_data_is_posix_read = _warc_options;
      *(code **)(_a + 2) = _warc_header;
      _a[2].vtable = (archive_vtable_conflict *)_warc_data;
      *(code **)&_a[2].archive_format = _warc_close;
      _a[2].archive_format_name = (char *)_warc_free;
      _a[1].read_data_requested = (size_t)_warc_finish_entry;
      _a->archive_format = 0xf0000;
      _a->archive_format_name = "WARC/1.0";
    }
  }
  return iVar4;
}

Assistant:

int
archive_write_set_format_warc(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct warc_s *w;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_warc");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL) {
		(a->format_free)(a);
	}

	w = malloc(sizeof(*w));
	if (w == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate warc data");
		return (ARCHIVE_FATAL);
	}
	/* by default we're emitting a file wide header */
	w->omit_warcinfo = 0U;
	/* obtain current time for date fields */
	w->now = time(NULL);
	/* reset file type info */
	w->typ = 0;
	/* also initialise our rng */
	w->rng = (unsigned int)w->now;

	a->format_data = w;
	a->format_name = "WARC/1.0";
	a->format_options = _warc_options;
	a->format_write_header = _warc_header;
	a->format_write_data = _warc_data;
	a->format_close = _warc_close;
	a->format_free = _warc_free;
	a->format_finish_entry = _warc_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_WARC;
	a->archive.archive_format_name = "WARC/1.0";
	return (ARCHIVE_OK);
}